

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O2

void writeFile(string *file,string *content)

{
  ofstream out;
  
  std::ofstream::ofstream((ostream *)&out,(string *)file,_S_out);
  std::operator<<((ostream *)&out,(string *)content);
  std::ostream::flush();
  std::ofstream::close();
  std::ofstream::~ofstream(&out);
  return;
}

Assistant:

void writeFile(const std::string& file, const std::string& content)
{
    std::ofstream out(file);
    out << content;
    out.flush();
    out.close();
}